

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xstring.c
# Opt level: O2

char * xultoa(char *buf,unsigned_long val,uint radix)

{
  char cVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  if (val == 0) {
    buf[0] = '0';
    buf[1] = '\0';
  }
  else {
    uVar5 = (ulong)radix;
    uVar2 = 0;
    do {
      uVar4 = uVar2;
      buf[uVar4] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ"[val % uVar5];
      bVar6 = uVar5 <= val;
      uVar2 = uVar4 + 1;
      val = val / uVar5;
    } while (bVar6);
    buf[uVar4 + 1 & 0xffffffff] = '\0';
    for (lVar3 = 0; lVar3 < (long)uVar4; lVar3 = lVar3 + 1) {
      cVar1 = buf[lVar3];
      buf[lVar3] = buf[uVar4];
      buf[uVar4] = cVar1;
      uVar4 = uVar4 - 1;
    }
  }
  return buf;
}

Assistant:

char* xultoa(char* buf, unsigned long val, unsigned radix)
{
    int l = 0;
    int r = 0;
    char c;

    if (!val)
    {
        buf[0] = '0';
        buf[1] = '\0';
        return buf;
    }

    do
    {
        buf[r++] = g_xstr_i2c_table[val % radix];
        val /= radix;
    }
    while (val);

    buf[r--] = '\0';

    /* string reverse */
    while (l < r)
    {
        c = buf[l];
        buf[l++] = buf[r];
        buf[r--] = c;
    }

    return buf;
}